

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  allocator local_1c9;
  string local_1c8;
  string local_1a8;
  string local_188;
  string test;
  model ftrl;
  model ftrl2;
  dataset xtest;
  
  std::__cxx11::string::string
            ((string *)&test,
             "0 3:1 6:1 17:1 27:1 35:1 40:1 57:1 63:1 69:1 73:1 74:1 76:1 81:1 103:1",
             (allocator *)&ftrl);
  dataset::dataset(&xtest,&test);
  model::model(&ftrl,0x7b,10.0,0.0,0.0,1.0);
  std::__cxx11::string::string((string *)&local_188,anon_var_dwarf_118c5,(allocator *)&ftrl2);
  model::fit(&ftrl,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string((string *)&local_1a8,anon_var_dwarf_118db,(allocator *)&ftrl2);
  model::save_model(&ftrl,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::string((string *)&local_1c8,anon_var_dwarf_118db,&local_1c9);
  model::model(&ftrl2,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  iVar1 = model::predict(&ftrl,&xtest,0.5);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar1 = model::predict(&ftrl2,&xtest,0.5);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  model::~model(&ftrl2);
  model::~model(&ftrl);
  dataset::~dataset(&xtest);
  std::__cxx11::string::~string((string *)&test);
  return 0;
}

Assistant:

int main() {
    string test = "0 3:1 6:1 17:1 27:1 35:1 40:1 57:1 63:1 69:1 73:1 74:1 76:1 81:1 103:1";
    dataset xtest(test);
    model ftrl(123, 10, 0, 0, 1);
    ftrl.fit("/Users/clytie/Documents/研究生/C++/algorithm/FTRL/data/Traindata.ftrl");
    ftrl.save_model("/Users/clytie/Documents/研究生/C++/algorithm/FTRL/data/model.ftrl");
    model ftrl2("/Users/clytie/Documents/研究生/C++/algorithm/FTRL/data/model.ftrl");
    cout << ftrl.predict(&xtest) << endl;
    cout << ftrl2.predict(&xtest) << endl;
    return 0;
}